

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int baseCur,int regRowid,int *aRegIdx,int isUpdate,
               int appendBias,int useSeekResult)

{
  bool bVar1;
  byte bVar2;
  Vdbe *p;
  Index *pIVar3;
  byte bVar4;
  ulong uVar5;
  int p3;
  
  p = sqlite3GetVdbe(pParse);
  pIVar3 = pTab->pIndex;
  if (pIVar3 != (Index *)0x0) {
    uVar5 = 0;
    do {
      pIVar3 = pIVar3->pNext;
      uVar5 = uVar5 + 1;
    } while (pIVar3 != (Index *)0x0);
    do {
      if (((aRegIdx[uVar5 - 1] != 0) &&
          (sqlite3VdbeAddOp3(p,0x61,baseCur + (int)uVar5,aRegIdx[uVar5 - 1],0), useSeekResult != 0))
         && (p->aOp != (Op *)0x0)) {
        p->aOp[(long)p->nOp + -1].p5 = '\x10';
      }
      bVar1 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
  }
  if (pParse->nTempReg == '\0') {
    p3 = pParse->nMem + 1;
    pParse->nMem = p3;
  }
  else {
    bVar2 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar2;
    p3 = pParse->aTempReg[bVar2];
  }
  sqlite3VdbeAddOp3(p,0x1f,regRowid + 1,(int)pTab->nCol,p3);
  sqlite3TableAffinityStr(p,pTab);
  sqlite3ExprCacheRemove(pParse,regRowid + 1,(int)pTab->nCol);
  bVar2 = (isUpdate != 0) * '\x02' + 3;
  if (pParse->nested != '\0') {
    bVar2 = 0;
  }
  bVar4 = bVar2 + 8;
  if (appendBias == 0) {
    bVar4 = bVar2;
  }
  bVar2 = bVar4 | 0x10;
  if (useSeekResult == 0) {
    bVar2 = bVar4;
  }
  sqlite3VdbeAddOp3(p,0x39,baseCur,p3,regRowid);
  if (pParse->nested == '\0') {
    sqlite3VdbeChangeP4(p,-1,pTab->zName,0);
  }
  if (p->aOp != (Op *)0x0) {
    p->aOp[(long)p->nOp + -1].p5 = bVar2;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int baseCur,        /* Index of a read/write cursor pointing at pTab */
  int regRowid,       /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int isUpdate,       /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  int i;
  Vdbe *v;
  int nIdx;
  Index *pIdx;
  u8 pik_flags;
  int regData;
  int regRec;

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){}
  for(i=nIdx-1; i>=0; i--){
    if( aRegIdx[i]==0 ) continue;
    sqlite3VdbeAddOp2(v, OP_IdxInsert, baseCur+i+1, aRegIdx[i]);
    if( useSeekResult ){
      sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
    }
  }
  regData = regRowid + 1;
  regRec = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regData, pTab->nCol, regRec);
  sqlite3TableAffinityStr(v, pTab);
  sqlite3ExprCacheAffinityChange(pParse, regData, pTab->nCol);
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (isUpdate?OPFLAG_ISUPDATE:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, baseCur, regRec, regRowid);
  if( !pParse->nested ){
    sqlite3VdbeChangeP4(v, -1, pTab->zName, P4_TRANSIENT);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}